

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_set.hpp
# Opt level: O0

void Omega_h::unite_with<char>
               (set<char,_std::less<char>,_std::allocator<char>_> *a,
               set<char,_std::less<char>,_std::allocator<char>_> *b)

{
  bool bVar1;
  reference __x;
  char *x;
  iterator __end0;
  iterator __begin0;
  set<char,_std::less<char>,_std::allocator<char>_> *__range2;
  set<char,_std::less<char>,_std::allocator<char>_> *b_local;
  set<char,_std::less<char>,_std::allocator<char>_> *a_local;
  
  __end0 = std::set<char,_std::less<char>,_std::allocator<char>_>::begin(b);
  x = (char *)std::set<char,_std::less<char>,_std::allocator<char>_>::end(b);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&x);
    if (!bVar1) break;
    __x = std::_Rb_tree_const_iterator<char>::operator*(&__end0);
    std::set<char,_std::less<char>,_std::allocator<char>_>::insert(a,__x);
    std::_Rb_tree_const_iterator<char>::operator++(&__end0);
  }
  return;
}

Assistant:

void unite_with(std::set<T>& a, std::set<T> const& b) {
  for (auto& x : b) a.insert(x);
}